

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

UdpBodySyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::UdpBodySyntax,slang::syntax::SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax>&,slang::syntax::UdpInitialStmtSyntax*,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::UdpEntrySyntax>&,slang::parsing::Token>
          (BumpAllocator *this,SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax> *args,
          UdpInitialStmtSyntax **args_1,Token *args_2,
          SyntaxList<slang::syntax::UdpEntrySyntax> *args_3,Token *args_4)

{
  Token table;
  Token endtable;
  UdpBodySyntax *this_00;
  
  this_00 = (UdpBodySyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((UdpBodySyntax *)this->endPtr < this_00 + 1) {
    this_00 = (UdpBodySyntax *)allocateSlow(this,0xb0,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  table.kind = args_2->kind;
  table._2_1_ = args_2->field_0x2;
  table.numFlags.raw = (args_2->numFlags).raw;
  table.rawLen = args_2->rawLen;
  table.info = args_2->info;
  endtable.kind = args_4->kind;
  endtable._2_1_ = args_4->field_0x2;
  endtable.numFlags.raw = (args_4->numFlags).raw;
  endtable.rawLen = args_4->rawLen;
  endtable.info = args_4->info;
  slang::syntax::UdpBodySyntax::UdpBodySyntax(this_00,args,*args_1,table,args_3,endtable);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }